

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AdvancedSharedIndexing::Run(AdvancedSharedIndexing *this)

{
  CallLogWrapper *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  bool bVar4;
  GLuint program;
  undefined4 extraout_EAX;
  int iVar5;
  long lVar6;
  void *__s;
  float *__s_00;
  float *pfVar7;
  uint uVar8;
  ulong uVar9;
  bool *compile_error;
  ulong uVar10;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "\nlayout(binding = 3, rgba32f) uniform image2D g_result_image;\nlayout (local_size_x = 4,local_size_y=4 ) in;\nshared vec4 g_shared1[4];\nshared mat4 g_shared2;\nshared struct {\n  float data[4];\n} g_shared3[4];\nshared struct Type { float data[4]; } g_shared4[4];\nshared Type g_shared5[4];\nuniform bool g_true = true;\nuniform float g_values[16] = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16 };\n\nvoid Sync() {\n  groupMemoryBarrier();\n  barrier();\n}\nvoid SetMemory(ivec2 xy, float value) {\n  g_shared1[xy.y][gl_LocalInvocationID.x] = value;\n  g_shared2[xy.y][xy.x] = value;\n  g_shared3[xy[1]].data[xy[0]] = value;\n  g_shared4[xy.y].data[xy[0]] = value;\n  g_shared5[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] = value;\n}\nbool CheckMemory(ivec2 xy, float expected) {\n  if (g_shared1[xy.y][xy[0]] != expected) return false;\n  if (g_shared2[xy[1]][xy[0]] != expected) return false;\n  if (g_shared3[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] != expected) return false;\n  if (g_shared4[gl_LocalInvocationID.y].data[xy.x] != expected) return false;\n  if (g_shared5[xy.y].data[xy.x] != expected) return false;\n  return true;\n}\nvoid main() {\n  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n  vec4 result = vec4(0, 1, 0, 1);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0)) result = vec4(1, 0, 0, 1);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0)) result = vec4(1, 0, 0, 1);\n\n  if (g_true && gl_LocalInvocationID.x < 10) {\n    SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0);\n    Sync();\n    if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0)) result = vec4(1, 0, 0, 1);\n  }\n\n  imageStore(g_result_image, thread_xy, result);\n}"
             ,"");
  program = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
  this->m_program = program;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    program = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar4 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar6 = -1;
  if (bVar4) {
    __s = operator_new(0x100);
    memset(__s,0,0x100);
    glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_texture);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
    glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8814,4,4,0,0x1908,0x1406,__s);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    operator_delete(__s,0x100);
    glu::CallLogWrapper::glBindImageTexture(this_00,3,this->m_texture,0,'\0',0,0x88b9,0x8814);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    __s_00 = (float *)operator_new(0x100);
    memset(__s_00,0,0x100);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
    uVar9 = 0x1908;
    glu::CallLogWrapper::glGetTexImage(this_00,0xde1,0,0x1908,0x1406,__s_00);
    auVar1._4_4_ = -(uint)(__s_00[1] != 1.0);
    auVar1._0_4_ = -(uint)(*__s_00 != 0.0);
    auVar1._8_4_ = -(uint)(__s_00[2] != 0.0);
    auVar1._12_4_ = -(uint)(__s_00[3] != 1.0);
    iVar5 = movmskps(extraout_EAX,auVar1);
    if (iVar5 == 0) {
      uVar3 = 0xffffffffffffffff;
      pfVar7 = __s_00;
      do {
        uVar10 = uVar3;
        if (uVar10 == 0xe) {
          bVar4 = false;
          goto LAB_0091f9fc;
        }
        auVar2._4_4_ = -(uint)(pfVar7[5] != 1.0);
        auVar2._0_4_ = -(uint)(pfVar7[4] != 0.0);
        auVar2._8_4_ = -(uint)(pfVar7[6] != 0.0);
        auVar2._12_4_ = -(uint)(pfVar7[7] != 1.0);
        uVar8 = movmskps((int)uVar9,auVar2);
        uVar9 = (ulong)uVar8;
        uVar3 = uVar10 + 1;
        pfVar7 = pfVar7 + 4;
      } while (uVar8 == 0);
      bVar4 = uVar10 + 1 < 0xf;
      lVar6 = uVar10 + 2;
    }
    else {
      bVar4 = true;
      lVar6 = 0;
    }
    anon_unknown_0::Output("Invalid data at index %d.\n",lVar6);
LAB_0091f9fc:
    operator_delete(__s_00,0x100);
    lVar6 = -(ulong)bVar4;
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs = NL
			"layout(binding = 3, rgba32f) uniform image2D g_result_image;" NL
			"layout (local_size_x = 4,local_size_y=4 ) in;" NL "shared vec4 g_shared1[4];" NL
			"shared mat4 g_shared2;" NL "shared struct {" NL "  float data[4];" NL "} g_shared3[4];" NL
			"shared struct Type { float data[4]; } g_shared4[4];" NL "shared Type g_shared5[4];" NL
			"uniform bool g_true = true;" NL
			"uniform float g_values[16] = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16 };" NL NL
			"void Sync() {" NL "  groupMemoryBarrier();" NL "  barrier();" NL "}" NL
			"void SetMemory(ivec2 xy, float value) {" NL "  g_shared1[xy.y][gl_LocalInvocationID.x] = value;" NL
			"  g_shared2[xy.y][xy.x] = value;" NL "  g_shared3[xy[1]].data[xy[0]] = value;" NL
			"  g_shared4[xy.y].data[xy[0]] = value;" NL
			"  g_shared5[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] = value;" NL "}" NL
			"bool CheckMemory(ivec2 xy, float expected) {" NL
			"  if (g_shared1[xy.y][xy[0]] != expected) return false;" NL
			"  if (g_shared2[xy[1]][xy[0]] != expected) return false;" NL
			"  if (g_shared3[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] != expected) return false;" NL
			"  if (g_shared4[gl_LocalInvocationID.y].data[xy.x] != expected) return false;" NL
			"  if (g_shared5[xy.y].data[xy.x] != expected) return false;" NL "  return true;" NL "}" NL
			"void main() {" NL "  const ivec2 thread_xy = ivec2(gl_LocalInvocationID);" NL
			"  vec4 result = vec4(0, 1, 0, 1);" NL NL
			"  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0);" NL "  Sync();" NL
			"  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0)) result = vec4(1, 0, 0, 1);" NL NL
			"  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0);" NL "  Sync();" NL
			"  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0)) result = vec4(1, 0, 0, 1);" NL NL
			"  if (g_true && gl_LocalInvocationID.x < 10) {" NL
			"    SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0);" NL "    Sync();" NL
			"    if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0)) result = vec4(1, 0, 0, 1);" NL
			"  }" NL NL "  imageStore(g_result_image, thread_xy, result);" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		/* init texture */
		{
			std::vector<vec4> data(4 * 4);
			glGenTextures(1, &m_texture);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 4, 4, 0, GL_RGBA, GL_FLOAT, &data[0][0]);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glBindImageTexture(3, m_texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);

		/* validate render target */
		{
			std::vector<vec4> data(4 * 4);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &data[0][0]);
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!IsEqual(data[i], vec4(0, 1, 0, 1)))
				{
					Output("Invalid data at index %d.\n", i);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}